

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodeSetPtr xmlXPathNodeSetMerge(xmlNodeSetPtr val1,xmlNodeSetPtr val2)

{
  uint uVar1;
  xmlNodePtr pxVar2;
  int iVar3;
  xmlNodePtr ns;
  ulong uVar4;
  long lVar5;
  
  if (val1 == (xmlNodeSetPtr)0x0) {
    val1 = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (val1 == (xmlNodeSetPtr)0x0) {
      val1 = (xmlNodeSetPtr)0x0;
    }
    else {
      val1->nodeNr = 0;
      val1->nodeMax = 0;
      val1->nodeTab = (xmlNodePtr *)0x0;
    }
    if (val1 == (xmlNodeSetPtr)0x0) {
      return (xmlNodeSetPtr)0x0;
    }
  }
  if ((val2 != (xmlNodeSetPtr)0x0) && (0 < val2->nodeNr)) {
    uVar1 = val1->nodeNr;
    lVar5 = 0;
    do {
      ns = val2->nodeTab[lVar5];
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          pxVar2 = val1->nodeTab[uVar4];
          if ((pxVar2 == ns) ||
             ((((pxVar2->type == XML_NAMESPACE_DECL && (ns->type == XML_NAMESPACE_DECL)) &&
               ((_xmlNs *)pxVar2->_private == (_xmlNs *)ns->_private)) &&
              (iVar3 = xmlStrEqual((xmlChar *)pxVar2->children,(xmlChar *)ns->children), iVar3 != 0)
              ))) goto LAB_001c0098;
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
      if (((val1->nodeMax <= val1->nodeNr) && (iVar3 = xmlXPathNodeSetGrow(val1), iVar3 < 0)) ||
         ((ns->type == XML_NAMESPACE_DECL &&
          (ns = xmlXPathNodeSetDupNs((xmlNodePtr)ns->_private,(xmlNsPtr)ns), ns == (xmlNodePtr)0x0))
         )) {
        xmlXPathFreeNodeSet(val1);
        return (xmlNodeSetPtr)0x0;
      }
      iVar3 = val1->nodeNr;
      val1->nodeNr = iVar3 + 1;
      val1->nodeTab[iVar3] = ns;
LAB_001c0098:
      lVar5 = lVar5 + 1;
    } while (lVar5 < val2->nodeNr);
  }
  return val1;
}

Assistant:

xmlNodeSetPtr
xmlXPathNodeSetMerge(xmlNodeSetPtr val1, xmlNodeSetPtr val2) {
    int i, j, initNr, skip;
    xmlNodePtr n1, n2;

    if (val1 == NULL) {
	val1 = xmlXPathNodeSetCreate(NULL);
        if (val1 == NULL)
            return (NULL);
    }
    if (val2 == NULL)
        return(val1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    initNr = val1->nodeNr;

    for (i = 0;i < val2->nodeNr;i++) {
	n2 = val2->nodeTab[i];
	/*
	 * check against duplicates
	 */
	skip = 0;
	for (j = 0; j < initNr; j++) {
	    n1 = val1->nodeTab[j];
	    if (n1 == n2) {
		skip = 1;
		break;
	    } else if ((n1->type == XML_NAMESPACE_DECL) &&
		       (n2->type == XML_NAMESPACE_DECL)) {
		if ((((xmlNsPtr) n1)->next == ((xmlNsPtr) n2)->next) &&
		    (xmlStrEqual(((xmlNsPtr) n1)->prefix,
			((xmlNsPtr) n2)->prefix)))
		{
		    skip = 1;
		    break;
		}
	    }
	}
	if (skip)
	    continue;

	/*
	 * grow the nodeTab if needed
	 */
        if (val1->nodeNr >= val1->nodeMax) {
            if (xmlXPathNodeSetGrow(val1) < 0)
                goto error;
        }
	if (n2->type == XML_NAMESPACE_DECL) {
	    xmlNsPtr ns = (xmlNsPtr) n2;
            xmlNodePtr nsNode = xmlXPathNodeSetDupNs((xmlNodePtr) ns->next, ns);

            if (nsNode == NULL)
                goto error;
	    val1->nodeTab[val1->nodeNr++] = nsNode;
	} else
	    val1->nodeTab[val1->nodeNr++] = n2;
    }

    return(val1);

error:
    xmlXPathFreeNodeSet(val1);
    return(NULL);
}